

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O3

void __thiscall QPDF::readHSharedObject(QPDF *this,BitStream h)

{
  vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *vec;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  pointer pHVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  iVar4 = BitStream::getBitsInt(&h,0x20);
  ((_Var1._M_head_impl)->shared_object_hints).first_shared_obj = iVar4;
  iVar4 = BitStream::getBitsInt(&h,0x20);
  *(long *)((long)&(_Var1._M_head_impl)->shared_object_hints + 8) = (long)iVar4;
  iVar4 = BitStream::getBitsInt(&h,0x20);
  *(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x10) = iVar4;
  iVar4 = BitStream::getBitsInt(&h,0x20);
  *(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x14) = iVar4;
  iVar4 = BitStream::getBitsInt(&h,0x10);
  *(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x18) = iVar4;
  iVar4 = BitStream::getBitsInt(&h,0x20);
  *(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x1c) = iVar4;
  iVar5 = BitStream::getBitsInt(&h,0x10);
  *(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x20) = iVar5;
  iVar4 = *(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x14);
  vec = (vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
        ((long)&(_Var1._M_head_impl)->shared_object_hints + 0x28);
  pHVar2 = *(pointer *)
            &((vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_> *)
             ((long)&(_Var1._M_head_impl)->shared_object_hints + 0x28))->
             super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
  ;
  if (*(pointer *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x30) != pHVar2) {
    *(pointer *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x30) = pHVar2;
  }
  uVar7 = 0;
  load_vector_int<QPDF::HSharedObjectEntry,int>(&h,iVar4,vec,iVar5,0);
  load_vector_int<QPDF::HSharedObjectEntry,int>(&h,iVar4,vec,1,4);
  while( true ) {
    if (iVar4 < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(iVar4);
    }
    if (uVar7 == (long)iVar4) break;
    lVar3 = *(long *)&((vector<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
                        *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x28))->
                      super__Vector_base<QPDF::HSharedObjectEntry,_std::allocator<QPDF::HSharedObjectEntry>_>
    ;
    uVar6 = ((long)*(pointer *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x30) - lVar3 >>
            2) * -0x5555555555555555;
    if (uVar6 < uVar7 || uVar6 - uVar7 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar7);
    }
    if (*(int *)(lVar3 + 4 + uVar7 * 0xc) != 0) {
      iVar5 = 4;
      do {
        BitStream::getBits(&h,0x20);
        iVar5 = iVar5 + -1;
      } while (iVar5 != 0);
    }
    uVar7 = uVar7 + 1;
  }
  load_vector_int<QPDF::HSharedObjectEntry,int>
            (&h,iVar4,vec,*(int *)((long)&(_Var1._M_head_impl)->shared_object_hints + 0x18),8);
  return;
}

Assistant:

void
QPDF::readHSharedObject(BitStream h)
{
    HSharedObject& t = m->shared_object_hints;

    t.first_shared_obj = h.getBitsInt(32);         // 1
    t.first_shared_offset = h.getBitsInt(32);      // 2
    t.nshared_first_page = h.getBitsInt(32);       // 3
    t.nshared_total = h.getBitsInt(32);            // 4
    t.nbits_nobjects = h.getBitsInt(16);           // 5
    t.min_group_length = h.getBitsInt(32);         // 6
    t.nbits_delta_group_length = h.getBitsInt(16); // 7

    QTC::TC(
        "qpdf",
        "QPDF lin nshared_total > nshared_first_page",
        (t.nshared_total > t.nshared_first_page) ? 1 : 0);

    std::vector<HSharedObjectEntry>& entries = t.entries;
    entries.clear();
    int nitems = t.nshared_total;
    load_vector_int(
        h, nitems, entries, t.nbits_delta_group_length, &HSharedObjectEntry::delta_group_length);
    load_vector_int(h, nitems, entries, 1, &HSharedObjectEntry::signature_present);
    for (size_t i = 0; i < toS(nitems); ++i) {
        if (entries.at(i).signature_present) {
            // Skip 128-bit MD5 hash.  These are not supported by acrobat, so they should probably
            // never be there.  We have no test case for this.
            for (int j = 0; j < 4; ++j) {
                (void)h.getBits(32);
            }
        }
    }
    load_vector_int(h, nitems, entries, t.nbits_nobjects, &HSharedObjectEntry::nobjects_minus_one);
}